

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_uint32_iterator_move_equalorlarger(roaring_uint32_iterator_t *it,uint32_t val)

{
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  roaring_bitmap_t *prVar4;
  uint16_t *puVar5;
  bool bVar6;
  _Bool _Var7;
  byte bVar8;
  ushort uVar9;
  roaring_container_iterator_t rVar10;
  ulong in_RAX;
  long lVar11;
  uint uVar12;
  bitset_container_t *container;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint16_t value;
  undefined8 uStack_38;
  
  prVar4 = it->parent;
  iVar3 = (prVar4->high_low_container).size;
  if ((long)iVar3 == 0) {
LAB_00108516:
    uVar14 = iVar3 - 1;
  }
  else {
    puVar5 = (prVar4->high_low_container).keys;
    uVar9 = (ushort)(val >> 0x10);
    if (puVar5[(long)iVar3 + -1] == uVar9) goto LAB_00108516;
    uVar15 = iVar3 - 1;
    uVar12 = 0;
    uVar13 = uVar15;
    do {
      if ((int)uVar15 < (int)uVar12) {
        uVar14 = ~uVar12;
        break;
      }
      uVar14 = uVar12 + uVar15 >> 1;
      uVar2 = *(ushort *)((long)puVar5 + (ulong)(uVar12 + uVar15 & 0xfffffffe));
      if (uVar2 < uVar9) {
        uVar12 = uVar14 + 1;
        bVar6 = true;
        uVar14 = uVar13;
      }
      else if (uVar9 < uVar2) {
        uVar15 = uVar14 - 1;
        bVar6 = true;
        uVar14 = uVar13;
      }
      else {
        bVar6 = false;
      }
      uVar13 = uVar14;
    } while (bVar6);
  }
  uStack_38 = in_RAX;
  if ((int)uVar14 < 0) {
    it->container_index = ~uVar14;
  }
  else {
    container = (bitset_container_t *)(prVar4->high_low_container).containers[uVar14];
    uVar1 = (prVar4->high_low_container).typecodes[uVar14];
    if (uVar1 == '\x04') {
      uVar1 = *(uint8_t *)&container->words;
      container = *(bitset_container_t **)container;
    }
    if (uVar1 == '\x03') {
      lVar11 = (long)container->cardinality;
      if (lVar11 == 0) {
LAB_001085e6:
        uVar9 = 0;
      }
      else {
        uVar9 = *(short *)((long)container->words + lVar11 * 4 + -2) +
                *(short *)((long)container->words + lVar11 * 4 + -4);
      }
    }
    else if (uVar1 == '\x02') {
      if ((long)container->cardinality == 0) goto LAB_001085e6;
      uVar9 = *(ushort *)((long)container->words + (long)container->cardinality * 2 + -2);
    }
    else {
      uVar9 = bitset_container_maximum(container);
    }
    uVar13 = (uint)uVar9;
    if (uVar13 < (val & 0xffff)) {
      it->container_index = uVar14 + 1;
    }
    else {
      it->container_index = uVar14;
      _Var7 = iter_new_container_partial_init(it);
      if (_Var7) {
        uStack_38 = uStack_38 & 0xffffffffffff;
        rVar10 = container_init_iterator
                           (it->container,it->typecode,(uint16_t *)((long)&uStack_38 + 6));
        (it->container_it).index = rVar10.index;
        _Var7 = container_iterator_lower_bound
                          (it->container,it->typecode,&it->container_it,
                           (uint16_t *)((long)&uStack_38 + 6),(uint16_t)val);
        uVar9 = (ushort)_Var7;
        if (_Var7) {
          it->current_value = (uint)uStack_38._6_2_ | it->highbits;
        }
      }
      else {
        uVar9 = 0;
      }
      it->has_value = SUB21(uVar9,0);
    }
    bVar8 = (byte)uVar9;
    if ((val & 0xffff) <= uVar13) goto LAB_0010866d;
  }
  bVar8 = loadfirstvalue(it);
  it->has_value = (_Bool)bVar8;
LAB_0010866d:
  return (_Bool)(bVar8 & 1);
}

Assistant:

bool roaring_uint32_iterator_move_equalorlarger(roaring_uint32_iterator_t *it,
                                                uint32_t val) {
    uint16_t hb = val >> 16;
    const int i = ra_get_index(&it->parent->high_low_container, hb);
    if (i >= 0) {
        uint32_t lowvalue =
            container_maximum(it->parent->high_low_container.containers[i],
                              it->parent->high_low_container.typecodes[i]);
        uint16_t lb = val & 0xFFFF;
        if (lowvalue < lb) {
            // will have to load first value of next container
            it->container_index = i + 1;
        } else {
            // the value is necessarily within the range of the container
            it->container_index = i;
            it->has_value = loadfirstvalue_largeorequal(it, val);
            return it->has_value;
        }
    } else {
        // there is no matching, so we are going for the next container
        it->container_index = -i - 1;
    }
    it->has_value = loadfirstvalue(it);
    return it->has_value;
}